

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessTexturesTests.cpp
# Opt level: O3

bool __thiscall gl4cts::DirectStateAccess::Textures::BindUnitTest::Check(BindUnitTest *this)

{
  ulong uVar1;
  ostringstream *this_00;
  long lVar2;
  int iVar3;
  deUint32 dVar4;
  undefined4 extraout_var;
  GLubyte *pGVar6;
  ulong uVar7;
  char *pcVar8;
  bool bVar9;
  string local_1e8;
  string local_1c8;
  undefined1 local_1a8 [120];
  ios_base local_130 [264];
  long lVar5;
  
  iVar3 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar5 = CONCAT44(extraout_var,iVar3);
  pGVar6 = (GLubyte *)operator_new__(0x18);
  this->m_result = pGVar6;
  (**(code **)(lVar5 + 0xff0))(0xcf5,1);
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"glPixelStorei has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                  ,0x1c3e);
  (**(code **)(lVar5 + 0xff0))(0xd05,1);
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"glPixelStorei has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                  ,0x1c41);
  bVar9 = false;
  (**(code **)(lVar5 + 0x1220))(0,0,2,3,0x1908,0x1401,this->m_result);
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"glDrawArrays call has failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                  ,0x1c45);
  if (*this->m_result == '\0') {
    uVar7 = 0xffffffffffffffff;
    do {
      if (uVar7 == 0x16) {
        return true;
      }
      lVar5 = uVar7 + 2;
      uVar1 = uVar7 + 1;
      lVar2 = uVar7 + 2;
      uVar7 = uVar1;
    } while (s_texture_data_rgba[lVar5] == this->m_result[lVar2]);
    bVar9 = 0x16 < uVar1;
  }
  local_1a8._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
  this_00 = (ostringstream *)(local_1a8 + 8);
  std::__cxx11::ostringstream::ostringstream(this_00);
  pcVar8 = "Framebuffer data ";
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"Framebuffer data ",0x11);
  DataToString_abi_cxx11_(&local_1c8,(BindUnitTest *)pcVar8,0x18,this->m_result);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,local_1c8._M_dataplus._M_p,local_1c8._M_string_length);
  pcVar8 = " does not match the reference values ";
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00," does not match the reference values ",0x25);
  DataToString_abi_cxx11_(&local_1e8,(BindUnitTest *)pcVar8,0x18,s_texture_data_rgba);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,local_1e8._M_dataplus._M_p,local_1e8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,".",1);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
    operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream(this_00);
  std::ios_base::~ios_base(local_130);
  return bVar9;
}

Assistant:

bool BindUnitTest::Check()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Setup storage for results. */
	m_result = new glw::GLubyte[s_texture_count_rgba];

	/* Setup pixel sotre modes.*/
	gl.pixelStorei(GL_UNPACK_ALIGNMENT, sizeof(glw::GLubyte));
	GLU_EXPECT_NO_ERROR(gl.getError(), "glPixelStorei has failed");

	gl.pixelStorei(GL_PACK_ALIGNMENT, sizeof(glw::GLubyte));
	GLU_EXPECT_NO_ERROR(gl.getError(), "glPixelStorei has failed");

	/* Query framebuffer's image. */
	gl.readPixels(0, 0, s_texture_width, s_texture_height, GL_RGBA, GL_UNSIGNED_BYTE, m_result);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glDrawArrays call has failed.");

	/* Compare values with reference. */
	for (glw::GLuint i = 0; i < s_texture_count_rgba; ++i)
	{
		if (s_texture_data_rgba[i] != m_result[i])
		{
			m_context.getTestContext().getLog()
				<< tcu::TestLog::Message << "Framebuffer data " << DataToString(s_texture_count_rgba, m_result)
				<< " does not match the reference values " << DataToString(s_texture_count_rgba, s_texture_data_rgba)
				<< "." << tcu::TestLog::EndMessage;

			return false;
		}
	}

	return true;
}